

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtOffsetCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  bool *pbVar4;
  bool *__s;
  ostringstream buf;
  ContextType local_1bc;
  string local_1b8;
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"in highp vec4 a_position;\n",0x1a);
  uVar1 = *(uint *)((long)this + 0x128);
  if (uVar1 < 3) {
    pbVar4 = ::glcts::fixed_sample_locations_values + 1;
    if (uVar1 == 2) {
      pbVar4 = (bool *)0x1c6abc4;
    }
    __s = (bool *)"centroid ";
    if (uVar1 != 1) {
      __s = pbVar4;
    }
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out highp vec2 v_screenPosition;\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out highp vec2 v_offset;\n",0x19);
  }
  else if (uVar1 == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out highp vec2[2] v_screenPosition;\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"out highp vec2 v_offset;\n",0x19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\tgl_Position = a_position;\n",0x1b);
  if (*(int *)((long)this + 0x128) == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "\tv_screenPosition[0] = a_position.xy; // not used\n\tv_screenPosition[1] = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2("
               ,0x77);
    poVar3 = (ostream *)std::ostream::operator<<(local_198,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0, ",4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "\tv_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(",0x42);
    poVar3 = (ostream *)std::ostream::operator<<(local_198,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0, ",4);
  }
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0);\n",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\tv_offset = a_position.xy * 0.5f;\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_1bc.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1b8,&local_1bc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtOffsetCase::genVertexSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;
	buf << "${GLSL_VERSION_DECL}\n"
		<< "${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
		<< "in highp vec4 a_position;\n";

	if (m_testType == TEST_QUALIFIER_NONE || m_testType == TEST_QUALIFIER_CENTROID || m_testType == TEST_QUALIFIER_SAMPLE)
	{
		const char* const qualifier = (m_testType == TEST_QUALIFIER_CENTROID) ? ("centroid ") : (m_testType == TEST_QUALIFIER_SAMPLE) ? ("sample ") : ("");
		buf << qualifier << "out highp vec2 v_screenPosition;\n"
			<< qualifier << "out highp vec2 v_offset;\n";
	}
	else if (m_testType == TEST_ARRAY_ELEMENT)
	{
		buf << "out highp vec2[2] v_screenPosition;\n"
			<< "out highp vec2 v_offset;\n";
	}
	else
		DE_ASSERT(false);

	buf	<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";

	if (m_testType != TEST_ARRAY_ELEMENT)
		buf	<< "	v_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(" << (int)RENDER_SIZE << ".0, " << (int)RENDER_SIZE << ".0);\n";
	else
		buf	<< "	v_screenPosition[0] = a_position.xy; // not used\n"
				"	v_screenPosition[1] = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(" << (int)RENDER_SIZE << ".0, " << (int)RENDER_SIZE << ".0);\n";

	buf	<< "	v_offset = a_position.xy * 0.5f;\n"
		<< "}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}